

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O2

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix8<256l>
          (fft<float,2048l,(re::fft::direction)1> *this,span<std::complex<float>,_256L> out)

{
  long lVar1;
  complex<float> *a;
  complex<float> *b;
  complex<float> *b_00;
  complex<float> *b_01;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  complex<float> *a_00;
  long lVar5;
  complex<float> *a_01;
  long lVar6;
  long lVar7;
  long lVar8;
  complex<float> *a_02;
  complex<float> *b_02;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  lVar4 = 0x38;
  lVar5 = 0x28;
  lVar6 = 0x20;
  lVar7 = 0;
  for (lVar8 = 0; lVar8 != 0xf8; lVar8 = lVar8 + 8) {
    lVar1 = (long)out.storage_.data_ + lVar8;
    b_02 = (complex<float> *)(lVar1 + 0x108);
    uVar2 = *(undefined8 *)(lVar1 + 0x208);
    uVar3 = *(undefined8 *)(lVar1 + 0x308);
    fVar11 = (float)b_02->_M_value;
    fVar12 = (float)(b_02->_M_value >> 0x20);
    fVar9 = (float)*(undefined8 *)(this + lVar6 * 8);
    fVar10 = (float)((ulong)*(undefined8 *)(this + lVar6 * 8) >> 0x20);
    b_02->_M_value = CONCAT44(fVar11 * fVar10 + fVar9 * fVar12,fVar11 * fVar9 + fVar10 * -fVar12);
    fVar10 = (float)((ulong)uVar2 >> 0x20);
    fVar9 = (float)uVar2;
    fVar11 = (float)*(undefined8 *)(this + lVar6 * 4);
    fVar12 = (float)((ulong)*(undefined8 *)(this + lVar6 * 4) >> 0x20);
    *(ulong *)(lVar1 + 0x208) =
         CONCAT44(fVar9 * fVar12 + fVar11 * fVar10,fVar9 * fVar11 + fVar12 * -fVar10);
    fVar10 = (float)((ulong)uVar3 >> 0x20);
    fVar9 = (float)uVar3;
    fVar11 = (float)*(undefined8 *)(this + lVar7 * 2 + 0x180);
    fVar12 = (float)((ulong)*(undefined8 *)(this + lVar7 * 2 + 0x180) >> 0x20);
    *(ulong *)(lVar1 + 0x308) =
         CONCAT44(fVar9 * fVar12 + fVar11 * fVar10,fVar9 * fVar11 + fVar12 * -fVar10);
    fVar10 = (float)((ulong)*(undefined8 *)(lVar1 + 0x408) >> 0x20);
    fVar9 = (float)*(undefined8 *)(lVar1 + 0x408);
    fVar11 = (float)*(undefined8 *)(this + lVar8 * 8 + 0x40);
    fVar12 = (float)((ulong)*(undefined8 *)(this + lVar8 * 8 + 0x40) >> 0x20);
    *(ulong *)(lVar1 + 0x408) =
         CONCAT44(fVar9 * fVar12 + fVar11 * fVar10,fVar9 * fVar11 + fVar12 * -fVar10);
    fVar10 = (float)((ulong)*(undefined8 *)(lVar1 + 0x508) >> 0x20);
    fVar9 = (float)*(undefined8 *)(lVar1 + 0x508);
    fVar11 = (float)*(undefined8 *)(this + lVar5 * 8);
    fVar12 = (float)((ulong)*(undefined8 *)(this + lVar5 * 8) >> 0x20);
    *(ulong *)(lVar1 + 0x508) =
         CONCAT44(fVar9 * fVar12 + fVar11 * fVar10,fVar9 * fVar11 + fVar12 * -fVar10);
    fVar10 = (float)((ulong)*(undefined8 *)(lVar1 + 0x608) >> 0x20);
    fVar9 = (float)*(undefined8 *)(lVar1 + 0x608);
    fVar11 = (float)*(undefined8 *)(this + lVar7 + 0xc0);
    fVar12 = (float)((ulong)*(undefined8 *)(this + lVar7 + 0xc0) >> 0x20);
    *(ulong *)(lVar1 + 0x608) =
         CONCAT44(fVar9 * fVar12 + fVar11 * fVar10,fVar9 * fVar11 + fVar12 * -fVar10);
    fVar10 = (float)((ulong)*(undefined8 *)(lVar1 + 0x708) >> 0x20);
    fVar9 = (float)*(undefined8 *)(lVar1 + 0x708);
    fVar11 = (float)*(undefined8 *)(this + lVar4 * 8);
    fVar12 = (float)((ulong)*(undefined8 *)(this + lVar4 * 8) >> 0x20);
    *(ulong *)(lVar1 + 0x708) =
         CONCAT44(fVar9 * fVar12 + fVar11 * fVar10,fVar9 * fVar11 + fVar12 * -fVar10);
    a = (complex<float> *)((long)out.storage_.data_ + 8 + lVar8);
    scissors<float>(a,b_02);
    a_01 = (complex<float> *)((long)out.storage_.data_ + lVar8 + 0x208);
    b = (complex<float> *)((long)out.storage_.data_ + 0x308 + lVar8);
    scissors<float>(a_01,b);
    a_00 = (complex<float> *)((long)out.storage_.data_ + lVar8 + 0x408);
    b_00 = (complex<float> *)((long)out.storage_.data_ + 0x508 + lVar8);
    scissors<float>(a_00,b_00);
    a_02 = (complex<float> *)((long)out.storage_.data_ + lVar8 + 0x608);
    b_01 = (complex<float> *)((long)out.storage_.data_ + 0x708 + lVar8);
    scissors<float>(a_02,b_01);
    b->_M_value = CONCAT44((int)b->_M_value,(int)(b->_M_value >> 0x20)) ^ 0x80000000;
    fVar10 = (float)(b_00->_M_value >> 0x20);
    fVar9 = (float)b_00->_M_value;
    fVar11 = (float)*(undefined8 *)(this + 0x100);
    fVar12 = (float)((ulong)*(undefined8 *)(this + 0x100) >> 0x20);
    b_00->_M_value = CONCAT44(fVar9 * fVar12 + fVar11 * fVar10,fVar9 * fVar11 + fVar12 * -fVar10);
    fVar11 = (float)*(undefined8 *)(this + 0x100);
    fVar12 = (float)((ulong)*(undefined8 *)(this + 0x100) >> 0x20);
    fVar9 = (float)b_01->_M_value;
    fVar10 = (float)(b_01->_M_value >> 0x20);
    b_01->_M_value =
         CONCAT44(fVar9 * fVar11 - fVar12 * fVar10,fVar12 * fVar9 + fVar10 * fVar11) ^ 0x80000000;
    scissors<float>(a,a_01);
    scissors<float>(b_02,b);
    scissors<float>(a_00,a_02);
    scissors<float>(b_00,b_01);
    a_02->_M_value = CONCAT44((int)a_02->_M_value,(int)(a_02->_M_value >> 0x20)) ^ 0x80000000;
    b_01->_M_value = CONCAT44((int)b_01->_M_value,(int)(b_01->_M_value >> 0x20)) ^ 0x80000000;
    scissors<float>(a,a_00);
    scissors<float>(b_02,b_00);
    scissors<float>(a_01,a_02);
    scissors<float>(b,b_01);
    lVar4 = lVar4 + 0x38;
    lVar7 = lVar7 + 0xc0;
    lVar5 = lVar5 + 0x28;
    lVar6 = lVar6 + 0x20;
  }
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }